

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QThreadPoolThread_*,_QHashDummyValue>::emplace_helper<QHashDummyValue>
          (QHash<QThreadPoolThread_*,_QHashDummyValue> *this,QThreadPoolThread **key,
          QHashDummyValue *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<QThreadPoolThread_*,_QHashDummyValue> *n;
  iterator<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_> *in_RDX;
  Data<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QThreadPoolThread*,QHashDummyValue>>::
  findOrInsert<QThreadPoolThread*>(in_RSI,(QThreadPoolThread **)in_RDX);
  n = QHashPrivate::iterator<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_>::node
                (in_RDX);
  QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>::createInPlace<QHashDummyValue>
            (n,(QThreadPoolThread **)in_RSI,(QHashDummyValue *)in_RDX);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }